

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

void Dau_DecFindSetsTest2(void)

{
  ulong uStack_28;
  int nVars;
  word t;
  word a1;
  word a0;
  Vec_Int_t *vSets;
  
  a1 = (s_Truths6[1] ^ 0xffffffffffffffff) & s_Truths6[2] | s_Truths6[1] & s_Truths6[3];
  t = (s_Truths6[1] ^ 0xffffffffffffffff) & s_Truths6[4] | s_Truths6[1] & s_Truths6[5];
  uStack_28 = (s_Truths6[0] ^ 0xffffffffffffffff) & a1 | s_Truths6[0] & t;
  a0 = (word)Dau_DecFindSets(&stack0xffffffffffffffd8,5);
  Dau_DecPrintSets((Vec_Int_t *)a0,5);
  Vec_IntFree((Vec_Int_t *)a0);
  return;
}

Assistant:

void Dau_DecFindSetsTest2()
{
    Vec_Int_t * vSets;
    word a0 = (~s_Truths6[1] & s_Truths6[2]) | (s_Truths6[1] & s_Truths6[3]);
    word a1 = (~s_Truths6[1] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[5]);
    word t  = (~s_Truths6[0] & a0)           | (s_Truths6[0] & a1); 
//    word t = ABC_CONST(0x7EFFFFFFFFFFFF7E); // and(gam1,gam2)
//    word t = ABC_CONST(0xB0F0BBFFB0F0BAFE); // some funct
//    word t = ABC_CONST(0x2B0228022B022802); // 5-var non-dec0x0F7700000F770000
//    word t = ABC_CONST(0x0F7700000F770000); // (!<(ab)cd>e)
//    word t = ABC_CONST(0x7F00000000000000); // (!(abc)def)
    int nVars = 5;

    vSets   = Dau_DecFindSets( &t, nVars );
    Dau_DecPrintSets( vSets, nVars );
    Vec_IntFree( vSets );
}